

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::OriginPubkeyProvider::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,StringType type)

{
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  OriginString_abi_cxx11_(&local_88,this,type,false);
  std::operator+(&local_68,"[",&local_88);
  std::operator+(&local_48,&local_68,"]");
  (**(code **)(**(long **)((long)this + 0x30) + 0x28))
            (&bStack_a8,*(long **)((long)this + 0x30),type);
  std::operator+(__return_storage_ptr__,&local_48,&bStack_a8);
  std::__cxx11::string::~string((string *)&bStack_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(StringType type) const override { return "[" + OriginString(type) + "]" + m_provider->ToString(type); }